

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void lookup_samplers(MOJOSHADER_glProgram *program,MOJOSHADER_glShader *shader,int *bound)

{
  MOJOSHADER_parseData *pMVar1;
  MOJOSHADER_sampler *pMVar2;
  int iVar3;
  GLint GVar4;
  int *piVar5;
  long lVar6;
  
  pMVar1 = shader->parseData;
  if (pMVar1->sampler_count != 0) {
    pMVar2 = pMVar1->samplers;
    iVar3 = (*ctx->profileMustPushSamplers)();
    if (iVar3 != 0) {
      if (*bound == 0) {
        (*ctx->profileUseProgram)(program);
        *bound = 1;
      }
      if (0 < pMVar1->sampler_count) {
        piVar5 = &pMVar2->index;
        lVar6 = 0;
        do {
          GVar4 = (*ctx->profileGetSamplerLocation)(program,shader,(int)lVar6);
          if (-1 < GVar4) {
            (*ctx->profilePushSampler)(GVar4,*piVar5);
          }
          lVar6 = lVar6 + 1;
          piVar5 = piVar5 + 6;
        } while (lVar6 < pMVar1->sampler_count);
      }
    }
  }
  return;
}

Assistant:

static void lookup_samplers(MOJOSHADER_glProgram *program,
                            MOJOSHADER_glShader *shader, int *bound)
{
    const MOJOSHADER_parseData *pd = shader->parseData;
    const MOJOSHADER_sampler *s = pd->samplers;
    int i;

    if ((pd->sampler_count == 0) || (!ctx->profileMustPushSamplers()))
        return;   // nothing to do here, so don't bother binding, etc.

    // Link up the Samplers. These never change after link time, since they
    //  are meant to be constant texture unit ids and not textures.

    if (!(*bound))
    {
        ctx->profileUseProgram(program);
        *bound = 1;
    } // if

    for (i = 0; i < pd->sampler_count; i++)
    {
        const GLint loc = ctx->profileGetSamplerLocation(program, shader, i);
        if (loc >= 0)  // maybe the Sampler was optimized out?
        {
#ifdef MOJOSHADER_XNA4_VERTEX_TEXTURES
            if (pd->shader_type == MOJOSHADER_TYPE_VERTEX)
                ctx->profilePushSampler(loc, s[i].index + ctx->vertex_sampler_offset);
            else
#endif
                ctx->profilePushSampler(loc, s[i].index);
        } // if
    } // for
}